

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalReturnNever(ShaderEvalContext *c)

{
  undefined8 uVar1;
  Vector<float,_3> local_28;
  VecAccess<float,_4,_3> local_18;
  
  local_28.m_data[2] = (c->coords).m_data[1];
  uVar1 = *(undefined8 *)((c->coords).m_data + 2);
  local_28.m_data[1] = (float)uVar1;
  local_28.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  local_18.m_vector = &c->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_28);
  return;
}

Assistant:

inline void evalReturnNever		(ShaderEvalContext& c) { c.color.xyz() = c.coords.swizzle(3,2,1); }